

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkNodeRef_rec(Vec_Int_t *vRefs,Acb_Ntk_t *p,int iObj,int *nGates)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  int iVar3;
  int *piVar4;
  int Type;
  int nFan;
  int Counter;
  int *pFanins;
  int Fanin;
  int i;
  int *nGates_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  Vec_Int_t *vRefs_local;
  
  Type = 1;
  iVar1 = Acb_ObjIsCi(p,iObj);
  if (iVar1 == 0) {
    if (nGates != (int *)0x0) {
      iVar1 = Acb_ObjFaninNum(p,iObj);
      AVar2 = Acb_ObjType(p,iObj);
      if (AVar2 == ABC_OPER_CONST_F) {
        *nGates = *nGates + 1;
      }
      else if (AVar2 == ABC_OPER_CONST_T) {
        nGates[1] = nGates[1] + 1;
      }
      else if ((AVar2 == ABC_OPER_BIT_BUF) || (AVar2 == ABC_OPER_CO)) {
        nGates[2] = nGates[2] + 1;
      }
      else if (AVar2 == ABC_OPER_BIT_INV) {
        nGates[3] = nGates[3] + 1;
      }
      else {
        if (iVar1 < 2) {
          __assert_fail("nFan >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                        ,0xcb,"int Acb_NtkNodeRef_rec(Vec_Int_t *, Acb_Ntk_t *, int, int *)");
        }
        iVar1 = Acb_ObjFaninNum(p,iObj);
        nGates[4] = iVar1 + -1 + nGates[4];
      }
    }
    pFanins._4_4_ = 0;
    piVar4 = Acb_ObjFanins(p,iObj);
    for (; pFanins._4_4_ < *piVar4; pFanins._4_4_ = pFanins._4_4_ + 1) {
      iVar1 = piVar4[pFanins._4_4_ + 1];
      iVar3 = Vec_IntEntry(vRefs,iVar1);
      if (iVar3 == 0) {
        iVar3 = Acb_NtkNodeRef_rec(vRefs,p,iVar1,nGates);
        Type = iVar3 + Type;
      }
      Vec_IntAddToEntry(vRefs,iVar1,1);
    }
    vRefs_local._4_4_ = Type;
  }
  else {
    vRefs_local._4_4_ = 0;
  }
  return vRefs_local._4_4_;
}

Assistant:

int Acb_NtkNodeRef_rec( Vec_Int_t * vRefs, Acb_Ntk_t * p, int iObj, int nGates[5] )
{
    int i, Fanin, * pFanins, Counter = 1;
    if ( Acb_ObjIsCi(p, iObj) )
        return 0;
    if ( nGates )
    {
        int nFan = Acb_ObjFaninNum(p, iObj);
        int Type = Acb_ObjType( p, iObj );
        if ( Type == ABC_OPER_CONST_F ) 
            nGates[0]++;
        else if ( Type == ABC_OPER_CONST_T ) 
            nGates[1]++;
        else if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_CO ) 
            nGates[2]++;
        else if ( Type == ABC_OPER_BIT_INV ) 
            nGates[3]++;
        else
        {
            assert( nFan >= 2 );
            nGates[4] += Acb_ObjFaninNum(p, iObj)-1;
        }
    }
    Acb_ObjForEachFaninFast( p, iObj, pFanins, Fanin, i )
    {
        if ( Vec_IntEntry(vRefs, Fanin) == 0 )
            Counter += Acb_NtkNodeRef_rec( vRefs, p, Fanin, nGates );
        Vec_IntAddToEntry( vRefs, Fanin, 1 );
    }
    return Counter;
}